

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pColorIdx,
          list<aiColor3D,_std::allocator<aiColor3D>_> *pColors,bool pColorPerVertex)

{
  undefined4 uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base local_60;
  long local_50;
  _List_node_base *local_48;
  undefined8 uStack_40;
  
  local_60._M_next = &local_60;
  local_50 = 0;
  local_60._M_prev = local_60._M_next;
  for (p_Var2 = (pColors->super__List_base<aiColor3D,_std::allocator<aiColor3D>_>)._M_impl._M_node.
                super__List_node_base._M_next; p_Var2 != (_List_node_base *)pColors;
      p_Var2 = (((_List_base<aiColor3D,_std::allocator<aiColor3D>_> *)&p_Var2->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    local_48 = p_Var2[1]._M_next;
    uStack_40 = 0;
    uVar1 = *(undefined4 *)&p_Var2[1]._M_prev;
    this = (X3DImporter *)operator_new(0x20);
    *(_List_node_base **)
     &(this->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header =
         local_48;
    *(undefined4 *)
     &(this->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = uVar1;
    *(undefined4 *)
     ((long)&(this->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent + 4) = 0x3f800000;
    std::__detail::_List_node_base::_M_hook((_List_node_base *)this);
    local_50 = local_50 + 1;
  }
  MeshGeometry_AddColor
            (this,pMesh,pCoordIdx,pColorIdx,
             (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_60,pColorPerVertex
            );
  p_Var2 = local_60._M_next;
  while (p_Var2 != &local_60) {
    p_Var3 = (((_List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&p_Var2->_M_next)
             ->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var3;
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pColorIdx,
										const std::list<aiColor3D>& pColors, const bool pColorPerVertex) const
{
    std::list<aiColor4D> tcol;

	// create RGBA array from RGB.
    for ( std::list<aiColor3D>::const_iterator it = pColors.begin(); it != pColors.end(); ++it )
    {
        tcol.push_back( aiColor4D( ( *it ).r, ( *it ).g, ( *it ).b, 1 ) );
    }

	// call existing function for adding RGBA colors
	MeshGeometry_AddColor(pMesh, pCoordIdx, pColorIdx, tcol, pColorPerVertex);
}